

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_buf_slot.cpp
# Opt level: O0

MPP_RET mpp_buf_slot_init(MppBufSlots *slots)

{
  RK_U32 RVar1;
  MPP_RET MVar2;
  MppBufSlotsImpl *impl_00;
  Mutex *this;
  MppBufSlotLogs *pMVar3;
  uint local_24;
  RK_U32 i;
  MppBufSlotsImpl *impl;
  MppBufSlots *slots_local;
  
  if (slots == (MppBufSlots *)0x0) {
    _mpp_log_l(2,"mpp_buf_slot","found NULL input\n","mpp_buf_slot_init");
    return MPP_ERR_NULL_PTR;
  }
  impl_00 = (MppBufSlotsImpl *)mpp_osal_calloc("mpp_buf_slot_init",0xf0);
  if (impl_00 == (MppBufSlotsImpl *)0x0) {
    *slots = (MppBufSlots)0x0;
    return MPP_NOK;
  }
  mpp_env_get_u32("buf_slot_debug",&buf_slot_debug,0x10000800);
  mpp_env_get_u32("use_legacy_align",&use_legacy_align,0);
  this = (Mutex *)operator_new(0x28);
  Mutex::Mutex(this);
  impl_00->lock = this;
  if (impl_00->lock != (Mutex *)0x0) {
    for (local_24 = 0; local_24 < 4; local_24 = local_24 + 1) {
      impl_00->queue[local_24].next = impl_00->queue + local_24;
      impl_00->queue[local_24].prev = impl_00->queue + local_24;
    }
    if ((buf_slot_debug & 0x10000000) != 0) {
      pMVar3 = buf_slot_logs_init(0x400);
      impl_00->logs = pMVar3;
      if (impl_00->logs == (MppBufSlotLogs *)0x0) goto LAB_0013eca2;
    }
    MVar2 = mpp_frame_init(&impl_00->info);
    if ((MVar2 == MPP_OK) && (MVar2 = mpp_frame_init(&impl_00->info_set), MVar2 == MPP_OK)) {
      impl_00->hal_hor_align = default_align_16;
      impl_00->hal_ver_align = default_align_16;
      impl_00->hal_len_align = (AlignFunc)0x0;
      impl_00->numerator = 9;
      impl_00->denominator = 5;
      RVar1 = buf_slot_idx + 1;
      impl_00->slots_idx = buf_slot_idx;
      buf_slot_idx = RVar1;
      impl_00->info_change_slot_idx = -1;
      impl_00->align_chk_log_env = (uint)((buf_slot_debug & 0x800) != 0);
      impl_00->align_chk_log_en = impl_00->align_chk_log_env;
      *slots = impl_00;
      return MPP_OK;
    }
  }
LAB_0013eca2:
  clear_slots_impl(impl_00);
  *slots = (MppBufSlots)0x0;
  return MPP_NOK;
}

Assistant:

MPP_RET mpp_buf_slot_init(MppBufSlots *slots)
{
    if (NULL == slots) {
        mpp_err_f("found NULL input\n");
        return MPP_ERR_NULL_PTR;
    }
    MppBufSlotsImpl *impl = mpp_calloc(MppBufSlotsImpl, 1);
    if (NULL == impl) {
        *slots = NULL;
        return MPP_NOK;
    }

    mpp_env_get_u32("buf_slot_debug", &buf_slot_debug,
                    BUF_SLOT_DBG_OPS_HISTORY | BUF_SLOT_DBG_INFO_SET);
    mpp_env_get_u32("use_legacy_align", &use_legacy_align, 0);

    do {
        impl->lock = new Mutex();
        if (NULL == impl->lock)
            break;

        for (RK_U32 i = 0; i < MPP_ARRAY_ELEMS(impl->queue); i++) {
            INIT_LIST_HEAD(&impl->queue[i]);
        }

        if (buf_slot_debug & BUF_SLOT_DBG_OPS_HISTORY) {
            impl->logs = buf_slot_logs_init(SLOT_OPS_MAX_COUNT);
            if (NULL == impl->logs)
                break;
        }

        if (mpp_frame_init(&impl->info))
            break;

        if (mpp_frame_init(&impl->info_set))
            break;

        // slots information default setup
        impl->hal_hor_align = default_align_16;
        impl->hal_ver_align = default_align_16;
        impl->hal_len_align = NULL;
        impl->numerator     = 9;
        impl->denominator   = 5;
        impl->slots_idx     = buf_slot_idx++;
        impl->info_change_slot_idx = -1;
        impl->align_chk_log_env = (buf_slot_debug & BUF_SLOT_DBG_INFO_SET) ? 1 : 0;
        impl->align_chk_log_en = impl->align_chk_log_env;

        *slots = impl;
        return MPP_OK;
    } while (0);

    clear_slots_impl(impl);

    *slots = NULL;
    return MPP_NOK;
}